

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O0

QPDFFileSpecObjectHelper * __thiscall
QPDFFileSpecObjectHelper::setFilename
          (QPDFFileSpecObjectHelper *this,string *unicode_name,string *compat_name)

{
  ulong uVar1;
  QPDFObjectHandle local_f8;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_c0 [24];
  string local_a8;
  undefined1 local_88 [24];
  string local_70;
  QPDFObjectHandle uf;
  string *compat_name_local;
  string *unicode_name_local;
  QPDFFileSpecObjectHelper *this_local;
  
  uf.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)compat_name;
  QPDFObjectHandle::newUnicodeString((QPDFObjectHandle *)&stack0xffffffffffffffd0,unicode_name);
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"/UF",(allocator<char> *)(local_88 + 0x17));
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)&stack0xffffffffffffffc0,&local_70,
             (QPDFObjectHandle *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)(local_88 + 0x17));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffc0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    QTC::TC("qpdf","QPDFFileSpecObjectHelper non-empty compat_name",0);
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"/F",&local_e1);
    QPDFObjectHandle::newString
              (&local_f8,
               (string *)
               uf.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_c0,&local_e0,&local_f8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_f8);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c0);
  }
  else {
    QTC::TC("qpdf","QPDFFileSpecObjectHelper empty compat_name",0);
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"/F",(allocator<char> *)(local_c0 + 0x17));
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_88,&local_a8,(QPDFObjectHandle *)&stack0xffffffffffffffd0);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_c0 + 0x17));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_88);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  return this;
}

Assistant:

QPDFFileSpecObjectHelper&
QPDFFileSpecObjectHelper::setFilename(
    std::string const& unicode_name, std::string const& compat_name)
{
    auto uf = QPDFObjectHandle::newUnicodeString(unicode_name);
    oh().replaceKey("/UF", uf);
    if (compat_name.empty()) {
        QTC::TC("qpdf", "QPDFFileSpecObjectHelper empty compat_name");
        oh().replaceKey("/F", uf);
    } else {
        QTC::TC("qpdf", "QPDFFileSpecObjectHelper non-empty compat_name");
        oh().replaceKey("/F", QPDFObjectHandle::newString(compat_name));
    }
    return *this;
}